

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedFieldInsertionIteratorsTest_Fibonacci_Test::TestBody
          (RepeatedFieldInsertionIteratorsTest_Fibonacci_Test *this)

{
  list<int,_std::allocator<int>_> *plVar1;
  RepeatedField<int> *this_00;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  _List_node_base *p_Var6;
  pointer *__ptr_5;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string local_48;
  
  plVar1 = &(this->super_RepeatedFieldInsertionIteratorsTest).fibonacci;
  p_Var6 = (this->super_RepeatedFieldInsertionIteratorsTest).fibonacci.
           super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
  ;
  this_00 = &(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0._impl_.
             repeated_int32_;
  if ((undefined1  [816])
      ((undefined1  [816])(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0 &
      (undefined1  [816])0x4) == (undefined1  [816])0x0) {
    piVar4 = (int *)((long)&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0 +
                    0x18);
  }
  else {
    piVar4 = (int *)protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  local_58[0] = (internal)(p_Var6 == (_List_node_base *)plVar1);
  if (!(bool)local_58[0]) {
    if (*(int *)&p_Var6[1]._M_next == *piVar4) {
      do {
        piVar4 = piVar4 + 1;
        p_Var6 = p_Var6->_M_next;
        local_58[0] = (internal)(p_Var6 == (_List_node_base *)plVar1);
        if ((bool)local_58[0]) goto LAB_0093c626;
      } while (*(int *)&p_Var6[1]._M_next == *piVar4);
    }
    local_58[0] = (internal)0x0;
  }
LAB_0093c626:
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,local_58,
               (AssertionResult *)
               "std::equal(fibonacci.begin(), fibonacci.end(), protobuffer.repeated_int32().begin())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x535,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    piVar4 = (int *)((long)&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0 +
                    0x18);
  }
  else {
    piVar4 = (int *)protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  uVar2 = (this_00->soo_rep_).field_0.long_rep.elements_int;
  if ((uVar2 & 4) == 0) {
    pcVar5 = (char *)((long)&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer.field_0 +
                     0x18);
  }
  else {
    pcVar5 = protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  iVar3 = protobuf::internal::SooRep::size(&this_00->soo_rep_,(uVar2 & 4) == 0);
  local_58[0] = (internal)(piVar4 == (int *)(pcVar5 + (long)iVar3 * 4));
  if (!(bool)local_58[0]) {
    p_Var6 = (plVar1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (*piVar4 == *(int *)&p_Var6[1]._M_next) {
      do {
        piVar4 = piVar4 + 1;
        local_58[0] = (internal)(piVar4 == (int *)(pcVar5 + (long)iVar3 * 4));
        if ((bool)local_58[0]) goto LAB_0093c757;
        p_Var6 = p_Var6->_M_next;
      } while (*piVar4 == *(int *)&p_Var6[1]._M_next);
    }
    local_58[0] = (internal)0x0;
  }
LAB_0093c757:
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,local_58,
               (AssertionResult *)
               "std::equal(protobuffer.repeated_int32().begin(), protobuffer.repeated_int32().end(), fibonacci.begin())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x538,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST_F(RepeatedFieldInsertionIteratorsTest, Fibonacci) {
  EXPECT_TRUE(std::equal(fibonacci.begin(), fibonacci.end(),
                         protobuffer.repeated_int32().begin()));
  EXPECT_TRUE(std::equal(protobuffer.repeated_int32().begin(),
                         protobuffer.repeated_int32().end(),
                         fibonacci.begin()));
}